

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O0

bool bssl::ext_supported_groups_add_clienthello
               (SSL_HANDSHAKE *hs,CBB *out,CBB *out_compressible,ssl_client_hello_type_t type)

{
  SSL *pSVar1;
  bool bVar2;
  uint16_t uVar3;
  int iVar4;
  pointer psVar5;
  iterator puVar6;
  uint16_t group;
  iterator __end1;
  iterator __begin1;
  Span<const_unsigned_short> *local_a0;
  Span<const_unsigned_short> *__range1;
  CBB groups_bytes;
  CBB contents;
  SSL *ssl;
  ssl_client_hello_type_t type_local;
  CBB *out_compressible_local;
  CBB *out_local;
  SSL_HANDSHAKE *hs_local;
  
  pSVar1 = hs->ssl;
  bVar2 = std::operator!=(&hs->pake_prover,(nullptr_t)0x0);
  if (bVar2) {
    hs_local._7_1_ = true;
  }
  else {
    iVar4 = CBB_add_u16(out_compressible,10);
    if (((iVar4 == 0) ||
        (iVar4 = CBB_add_u16_length_prefixed(out_compressible,(CBB *)((long)&groups_bytes.u + 0x18))
        , iVar4 == 0)) ||
       (iVar4 = CBB_add_u16_length_prefixed((CBB *)((long)&groups_bytes.u + 0x18),(CBB *)&__range1),
       iVar4 == 0)) {
      hs_local._7_1_ = false;
    }
    else {
      psVar5 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::operator->(&pSVar1->ctx);
      if ((*(ushort *)&psVar5->field_0x288 >> 5 & 1) != 0) {
        uVar3 = ssl_get_grease_value(hs,ssl_grease_group);
        iVar4 = CBB_add_u16((CBB *)&__range1,uVar3);
        if (iVar4 == 0) {
          return false;
        }
      }
      ___begin1 = tls1_get_grouplist(hs);
      local_a0 = (Span<const_unsigned_short> *)&__begin1;
      __end1 = Span<const_unsigned_short>::begin(local_a0);
      puVar6 = Span<const_unsigned_short>::end(local_a0);
      for (; __end1 != puVar6; __end1 = __end1 + 1) {
        uVar3 = *__end1;
        bVar2 = is_post_quantum_group(uVar3);
        if (((!bVar2) || (0x303 < hs->max_version)) &&
           (iVar4 = CBB_add_u16((CBB *)&__range1,uVar3), iVar4 == 0)) {
          return false;
        }
      }
      iVar4 = CBB_flush(out_compressible);
      hs_local._7_1_ = iVar4 != 0;
    }
  }
  return hs_local._7_1_;
}

Assistant:

static bool ext_supported_groups_add_clienthello(const SSL_HANDSHAKE *hs,
                                                 CBB *out,
                                                 CBB *out_compressible,
                                                 ssl_client_hello_type_t type) {
  const SSL *const ssl = hs->ssl;
  // In PAKE mode, supported_groups and key_share are not used.
  if (hs->pake_prover != nullptr) {
    return true;
  }

  CBB contents, groups_bytes;
  if (!CBB_add_u16(out_compressible, TLSEXT_TYPE_supported_groups) ||
      !CBB_add_u16_length_prefixed(out_compressible, &contents) ||
      !CBB_add_u16_length_prefixed(&contents, &groups_bytes)) {
    return false;
  }

  // Add a fake group. See RFC 8701.
  if (ssl->ctx->grease_enabled &&
      !CBB_add_u16(&groups_bytes, ssl_get_grease_value(hs, ssl_grease_group))) {
    return false;
  }

  for (uint16_t group : tls1_get_grouplist(hs)) {
    if (is_post_quantum_group(group) && hs->max_version < TLS1_3_VERSION) {
      continue;
    }
    if (!CBB_add_u16(&groups_bytes, group)) {
      return false;
    }
  }

  return CBB_flush(out_compressible);
}